

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall
Dumper::_dumpDefSites
          (Dumper *this,
          set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          *defs,char *kind)

{
  bool bVar1;
  reference pGVar2;
  type tVar3;
  type tVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  _Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *in_RDI;
  DefSite *def;
  iterator __end1;
  iterator __begin1;
  set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *__range1;
  set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::
          set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ::empty((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)0x17c8a7);
  if (!bVar1) {
    printf("<tr><td></td><td>------ %s ------</td></tr>\n",local_18);
    local_20 = local_10;
    local_28._M_node =
         (_Base_ptr)
         std::
         set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
         ::end(in_stack_ffffffffffffffb8);
    while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
      pGVar2 = std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator*
                         ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
                          0x17c90f);
      puts("<tr><td></td><td>");
      printName((Dumper *)__begin1._M_node,(RWNode *)__end1._M_node);
      bVar1 = dg::Offset::isUnknown((Offset *)(pGVar2 + 8));
      if (bVar1) {
        printf(" [? - ");
      }
      else {
        tVar3 = dg::Offset::operator*((Offset *)(pGVar2 + 8));
        printf(" [%lu - ",tVar3);
      }
      bVar1 = dg::Offset::isUnknown((Offset *)(pGVar2 + 0x10));
      if (bVar1) {
        printf("?]");
      }
      else {
        tVar3 = dg::Offset::operator*((Offset *)(pGVar2 + 8));
        tVar4 = dg::Offset::operator*((Offset *)(pGVar2 + 0x10));
        printf("%lu]",tVar3 + (tVar4 - 1));
      }
      puts("</td></tr>\n");
      std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator++(in_RDI);
    }
  }
  return;
}

Assistant:

void _dumpDefSites(const std::set<DefSite> &defs, const char *kind) {
        if (defs.empty())
            return;

        printf("<tr><td></td><td>------ %s ------</td></tr>\n", kind);
        for (const DefSite &def : defs) {
            puts("<tr><td></td><td>");
            printName(def.target);
            if (def.offset.isUnknown())
                printf(" [? - ");
            else
                printf(" [%" PRIu64 " - ", *def.offset);

            if (def.len.isUnknown())
                printf("?]");
            else
                printf("%" PRIu64 "]", *def.offset + (*def.len - 1));
            puts("</td></tr>\n");
        }
    }